

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_gf_group_index(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = is_one_pass_rt_params(cpi);
  if ((iVar1 == 0) || (*(int *)(in_RDI + 0x9d330) != *(int *)(in_RDI + 0x9d338) + -1)) {
    *(char *)(in_RDI + 0x712c0) = *(char *)(in_RDI + 0x712c0) + '\x01';
  }
  else {
    *(char *)(in_RDI + 0x712c0) = *(char *)(in_RDI + 0x712c0) + '\x01';
    if (*(char *)(in_RDI + 0x712c0) == -6) {
      *(undefined1 *)(in_RDI + 0x712c0) = 0;
    }
  }
  return;
}

Assistant:

static inline void update_gf_group_index(AV1_COMP *cpi) {
  // Increment the gf group index ready for the next frame.
  if (is_one_pass_rt_params(cpi) &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    ++cpi->gf_frame_index;
    // Reset gf_frame_index in case it reaches MAX_STATIC_GF_GROUP_LENGTH
    // for real time encoding.
    if (cpi->gf_frame_index == MAX_STATIC_GF_GROUP_LENGTH)
      cpi->gf_frame_index = 0;
  } else {
    ++cpi->gf_frame_index;
  }
}